

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

void __thiscall
TTD::SlabAllocatorBase<0>::ComputeMemoryUsed
          (SlabAllocatorBase<0> *this,uint64 *usedSpace,uint64 *reservedSpace)

{
  uint64 uVar1;
  SlabBlock *pSVar2;
  LargeSlabBlock *pLVar3;
  
  pSVar2 = this->m_headBlock;
  if (pSVar2 == (SlabBlock *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + this->m_slabBlockSize;
      pSVar2 = pSVar2->Previous;
    } while (pSVar2 != (SlabBlock *)0x0);
  }
  for (pLVar3 = this->m_largeBlockList; pLVar3 != (LargeSlabBlock *)0x0; pLVar3 = pLVar3->Previous)
  {
    uVar1 = uVar1 + pLVar3->TotalBlockSize;
  }
  *usedSpace = this->m_totalAllocatedSize;
  *reservedSpace = uVar1;
  return;
}

Assistant:

void ComputeMemoryUsed(uint64* usedSpace, uint64* reservedSpace) const
        {
            uint64 memreserved = 0;

            for (SlabBlock* currBlock = this->m_headBlock; currBlock != nullptr; currBlock = currBlock->Previous)
            {
                memreserved += (uint64)this->m_slabBlockSize;
            }

            for (LargeSlabBlock* currLargeBlock = this->m_largeBlockList; currLargeBlock != nullptr; currLargeBlock = currLargeBlock->Previous)
            {
                memreserved += (uint64)(currLargeBlock->TotalBlockSize);
            }

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            *usedSpace = this->m_totalAllocatedSize;
#else
            *usedSpace = 0;
#endif

            *reservedSpace = memreserved;
        }